

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O2

double util::rpn_eval(stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *stack,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                             *vars)

{
  char cVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  _Elt_pointer pdVar5;
  const_iterator cVar6;
  runtime_error *this;
  _Elt_pointer pbVar7;
  ulong uVar8;
  long lVar9;
  double local_c8;
  double local_c0;
  vector<double,_std::allocator<double>_> args;
  stack<double,_std::deque<double,_std::allocator<double>_>_> argstack;
  _Vector_base<double,_std::allocator<double>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  
  if ((rpn_eval(std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::unordered_map<std::__cxx11::string,double,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&)
       ::rpn_eval_funcs == '\0') &&
     (iVar4 = __cxa_guard_acquire(&rpn_eval(std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::unordered_map<std::__cxx11::string,double,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&)
                                   ::rpn_eval_funcs), iVar4 != 0)) {
    rpn_eval::rpn_eval_funcs[0].op = '+';
    rpn_eval::rpn_eval_funcs[0].name = "add";
    rpn_eval::rpn_eval_funcs[0].args = 2;
    rpn_eval::rpn_eval_funcs[0].func = rpn_eval_add;
    rpn_eval::rpn_eval_funcs[1].op = '-';
    rpn_eval::rpn_eval_funcs[1].name = "sub";
    rpn_eval::rpn_eval_funcs[1].args = 2;
    rpn_eval::rpn_eval_funcs[1].func = rpn_eval_sub;
    rpn_eval::rpn_eval_funcs[2].op = '*';
    rpn_eval::rpn_eval_funcs[2].name = "mul";
    rpn_eval::rpn_eval_funcs[2].args = 2;
    rpn_eval::rpn_eval_funcs[2].func = rpn_eval_mul;
    rpn_eval::rpn_eval_funcs[3].op = '/';
    rpn_eval::rpn_eval_funcs[3].name = "div";
    rpn_eval::rpn_eval_funcs[3].args = 2;
    rpn_eval::rpn_eval_funcs[3].func = rpn_eval_div;
    rpn_eval::rpn_eval_funcs[4].op = '%';
    rpn_eval::rpn_eval_funcs[4].name = "mod";
    rpn_eval::rpn_eval_funcs[4].args = 2;
    rpn_eval::rpn_eval_funcs[4].func = rpn_eval_mod;
    rpn_eval::rpn_eval_funcs[5].op = '&';
    rpn_eval::rpn_eval_funcs[5].name = "bitand";
    rpn_eval::rpn_eval_funcs[5].args = 2;
    rpn_eval::rpn_eval_funcs[5].func = rpn_eval_bitand;
    rpn_eval::rpn_eval_funcs[6].op = '|';
    rpn_eval::rpn_eval_funcs[6].name = "bitor";
    rpn_eval::rpn_eval_funcs[6].args = 2;
    rpn_eval::rpn_eval_funcs[6].func = rpn_eval_bitor;
    rpn_eval::rpn_eval_funcs[7].op = '^';
    rpn_eval::rpn_eval_funcs[7].name = "bitxor";
    rpn_eval::rpn_eval_funcs[7].args = 2;
    rpn_eval::rpn_eval_funcs[7].func = rpn_eval_bitxor;
    rpn_eval::rpn_eval_funcs[8].op = '~';
    rpn_eval::rpn_eval_funcs[8].name = "bitnot";
    rpn_eval::rpn_eval_funcs[8].args = 1;
    rpn_eval::rpn_eval_funcs[8].func = rpn_eval_bitnot;
    rpn_eval::rpn_eval_funcs[9].op = '\x05';
    rpn_eval::rpn_eval_funcs[9].name = "and";
    rpn_eval::rpn_eval_funcs[9].args = 2;
    rpn_eval::rpn_eval_funcs[9].func = rpn_eval_and;
    rpn_eval::rpn_eval_funcs[10].op = '\x06';
    rpn_eval::rpn_eval_funcs[10].name = "or";
    rpn_eval::rpn_eval_funcs[10].args = 2;
    rpn_eval::rpn_eval_funcs[10].func = rpn_eval_or;
    rpn_eval::rpn_eval_funcs[0xb].op = '!';
    rpn_eval::rpn_eval_funcs[0xb].name = "not";
    rpn_eval::rpn_eval_funcs[0xb].args = 1;
    rpn_eval::rpn_eval_funcs[0xb].func = rpn_eval_not;
    rpn_eval::rpn_eval_funcs[0xc].op = '\a';
    rpn_eval::rpn_eval_funcs[0xc].name = "neg";
    rpn_eval::rpn_eval_funcs[0xc].args = 1;
    rpn_eval::rpn_eval_funcs[0xc].func = rpn_eval_neg;
    rpn_eval::rpn_eval_funcs[0xd].op = ' ';
    rpn_eval::rpn_eval_funcs[0xd].name = "pow";
    rpn_eval::rpn_eval_funcs[0xd].args = 2;
    rpn_eval::rpn_eval_funcs[0xd].func = rpn_eval_pow;
    rpn_eval::rpn_eval_funcs[0xe].op = ' ';
    rpn_eval::rpn_eval_funcs[0xe].name = "sqrt";
    rpn_eval::rpn_eval_funcs[0xe].args = 1;
    rpn_eval::rpn_eval_funcs[0xe].func = rpn_eval_sqrt;
    rpn_eval::rpn_eval_funcs[0xf].op = ' ';
    rpn_eval::rpn_eval_funcs[0xf].name = "log";
    rpn_eval::rpn_eval_funcs[0xf].args = 1;
    rpn_eval::rpn_eval_funcs[0xf].func = rpn_eval_log;
    rpn_eval::rpn_eval_funcs[0x10].op = ' ';
    rpn_eval::rpn_eval_funcs[0x10].name = "exp";
    rpn_eval::rpn_eval_funcs[0x10].args = 1;
    rpn_eval::rpn_eval_funcs[0x10].func = rpn_eval_exp;
    rpn_eval::rpn_eval_funcs[0x11].op = ' ';
    rpn_eval::rpn_eval_funcs[0x11].name = "ln";
    rpn_eval::rpn_eval_funcs[0x11].args = 1;
    rpn_eval::rpn_eval_funcs[0x11].func = rpn_eval_ln;
    rpn_eval::rpn_eval_funcs[0x12].op = ' ';
    rpn_eval::rpn_eval_funcs[0x12].name = "sin";
    rpn_eval::rpn_eval_funcs[0x12].args = 1;
    rpn_eval::rpn_eval_funcs[0x12].func = rpn_eval_sin;
    rpn_eval::rpn_eval_funcs[0x13].op = ' ';
    rpn_eval::rpn_eval_funcs[0x13].name = "cos";
    rpn_eval::rpn_eval_funcs[0x13].args = 1;
    rpn_eval::rpn_eval_funcs[0x13].func = rpn_eval_cos;
    rpn_eval::rpn_eval_funcs[0x14].op = ' ';
    rpn_eval::rpn_eval_funcs[0x14].name = "tan";
    rpn_eval::rpn_eval_funcs[0x14].args = 1;
    rpn_eval::rpn_eval_funcs[0x14].func = rpn_eval_tan;
    rpn_eval::rpn_eval_funcs[0x15].op = ' ';
    rpn_eval::rpn_eval_funcs[0x15].name = "rand";
    rpn_eval::rpn_eval_funcs[0x15].args = 2;
    rpn_eval::rpn_eval_funcs[0x15].func = rpn_eval_rand;
    rpn_eval::rpn_eval_funcs[0x16].op = ' ';
    rpn_eval::rpn_eval_funcs[0x16].name = "min";
    rpn_eval::rpn_eval_funcs[0x16].args = 2;
    rpn_eval::rpn_eval_funcs[0x16].func = rpn_eval_min;
    rpn_eval::rpn_eval_funcs[0x17].op = ' ';
    rpn_eval::rpn_eval_funcs[0x17].name = "max";
    rpn_eval::rpn_eval_funcs[0x17].args = 2;
    rpn_eval::rpn_eval_funcs[0x17].func = rpn_eval_max;
    rpn_eval::rpn_eval_funcs[0x18].op = ' ';
    rpn_eval::rpn_eval_funcs[0x18].name = "ceil";
    rpn_eval::rpn_eval_funcs[0x18].args = 1;
    rpn_eval::rpn_eval_funcs[0x18].func = rpn_eval_ceil;
    rpn_eval::rpn_eval_funcs[0x19].op = ' ';
    rpn_eval::rpn_eval_funcs[0x19].name = "round";
    rpn_eval::rpn_eval_funcs[0x19].args = 1;
    rpn_eval::rpn_eval_funcs[0x19].func = rpn_eval_round;
    rpn_eval::rpn_eval_funcs[0x1a].op = ' ';
    rpn_eval::rpn_eval_funcs[0x1a].name = "floor";
    rpn_eval::rpn_eval_funcs[0x1a].args = 1;
    rpn_eval::rpn_eval_funcs[0x1a].func = rpn_eval_floor;
    rpn_eval::rpn_eval_funcs[0x1b].op = '<';
    rpn_eval::rpn_eval_funcs[0x1b].name = "lt";
    rpn_eval::rpn_eval_funcs[0x1b].args = 2;
    rpn_eval::rpn_eval_funcs[0x1b].func = rpn_eval_lt;
    rpn_eval::rpn_eval_funcs[0x1c].op = '\x03';
    rpn_eval::rpn_eval_funcs[0x1c].name = "lte";
    rpn_eval::rpn_eval_funcs[0x1c].args = 2;
    rpn_eval::rpn_eval_funcs[0x1c].func = rpn_eval_lte;
    rpn_eval::rpn_eval_funcs[0x1d].op = '=';
    rpn_eval::rpn_eval_funcs[0x1d].name = "eq";
    rpn_eval::rpn_eval_funcs[0x1d].args = 2;
    rpn_eval::rpn_eval_funcs[0x1d].func = rpn_eval_eq;
    rpn_eval::rpn_eval_funcs[0x1e].op = '\x02';
    rpn_eval::rpn_eval_funcs[0x1e].name = "ne";
    rpn_eval::rpn_eval_funcs[0x1e].args = 2;
    rpn_eval::rpn_eval_funcs[0x1e].func = rpn_eval_ne;
    rpn_eval::rpn_eval_funcs[0x1f].op = '\x04';
    rpn_eval::rpn_eval_funcs[0x1f].name = "gte";
    rpn_eval::rpn_eval_funcs[0x1f].args = 2;
    rpn_eval::rpn_eval_funcs[0x1f].func = rpn_eval_gte;
    rpn_eval::rpn_eval_funcs[0x20].op = '>';
    rpn_eval::rpn_eval_funcs[0x20].name = "gt";
    rpn_eval::rpn_eval_funcs[0x20].args = 2;
    rpn_eval::rpn_eval_funcs[0x20].func = rpn_eval_gt;
    rpn_eval::rpn_eval_funcs[0x21].op = '?';
    rpn_eval::rpn_eval_funcs[0x21].name = "iif";
    rpn_eval::rpn_eval_funcs[0x21].args = 3;
    rpn_eval::rpn_eval_funcs[0x21].func = rpn_eval_iif;
    __cxa_guard_release(&rpn_eval(std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::unordered_map<std::__cxx11::string,double,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&)
                         ::rpn_eval_funcs);
  }
  std::stack<double,std::deque<double,std::allocator<double>>>::
  stack<std::deque<double,std::allocator<double>>,void>(&argstack);
LAB_00174a87:
  if ((stack->c).
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (stack->c).
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
        ._M_finish._M_cur ==
        argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
        ._M_start._M_cur) {
      local_c8 = 0.0;
    }
    else {
      if (argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
        ._M_finish._M_cur =
             argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_c8 = argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur[-1];
    }
  }
  else {
    while( true ) {
      pbVar7 = (stack->c).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pbVar7 == (stack->c).
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar7 = (stack->c).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      __k = pbVar7 + -1;
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&stack->c);
      lVar9 = 0x18;
      while( true ) {
        if (lVar9 == 0x458) {
          cVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&vars->_M_h,__k);
          if (cVar6.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
              ._M_cur == (__node_type *)0x0) {
            args.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start = (pointer)tdparse(__k);
            std::deque<double,_std::allocator<double>_>::emplace_back<double>
                      (&argstack.c,(double *)&args);
          }
          else {
            std::deque<double,_std::allocator<double>_>::push_back
                      (&argstack.c,
                       (value_type_conflict5 *)
                       ((long)cVar6.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                              ._M_cur + 0x28));
          }
          goto LAB_00174a87;
        }
        bVar3 = std::operator==(__k,*(char **)(&timeago[abi:cxx11](double,double)::times_abi_cxx11_
                                              + lVar9));
        if ((bVar3) ||
           ((cVar1 = *(char *)((long)&timeago[abi:cxx11](double,double)::times_abi_cxx11_.
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar9),
            cVar1 != ' ' && (*(__k->_M_dataplus)._M_p == cVar1)))) break;
        lVar9 = lVar9 + 0x20;
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&args,*(size_type *)(&rand_init::rand_init::initialized + lVar9),
                 (allocator_type *)&local_c0);
      for (uVar8 = 0; uVar8 < *(ulong *)(&rand_init::rand_init::initialized + lVar9);
          uVar8 = uVar8 + 1) {
        if (argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"RPN Stack underflow");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pdVar5 = argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first) {
          pdVar5 = argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        args.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8] = pdVar5[-1];
        std::deque<double,_std::allocator<double>_>::pop_back(&argstack.c);
      }
      pcVar2 = *(code **)(&rpn_eval::rpn_eval_funcs[0].op + lVar9);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_48,&args);
      local_c0 = (double)(*pcVar2)(&local_48);
      std::deque<double,_std::allocator<double>_>::emplace_back<double>(&argstack.c,&local_c0);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
      if ((stack->c).
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (stack->c).
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&args.super__Vector_base<double,_std::allocator<double>_>);
    }
    if (argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
        ._M_finish._M_cur ==
        argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
        ._M_finish._M_first) {
      argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur =
           argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
           super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_c8 = argstack.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur[-1];
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&args.super__Vector_base<double,_std::allocator<double>_>);
  }
  std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base
            ((_Deque_base<double,_std::allocator<double>_> *)&argstack);
  return local_c8;
}

Assistant:

double rpn_eval(std::stack<std::string> stack, const std::unordered_map<std::string, double>& vars)
{
	struct rpn_eval_func
	{
		char op;
		const char *name;
		std::size_t args;
		double (*func)(std::vector<double>);

		rpn_eval_func(char op_, const char *name_, std::size_t args_, double (*func_)(std::vector<double>)) : op(op_), name(name_), args(args_), func(func_) { }
	};

	static const rpn_eval_func rpn_eval_funcs[] = {
		rpn_eval_func('+', "add",   2, rpn_eval_add),
		rpn_eval_func('-', "sub",   2, rpn_eval_sub),
		rpn_eval_func('*', "mul",   2, rpn_eval_mul),
		rpn_eval_func('/', "div",   2, rpn_eval_div),
		rpn_eval_func('%', "mod",   2, rpn_eval_mod),
		rpn_eval_func('&', "bitand",2, rpn_eval_bitand),
		rpn_eval_func('|', "bitor", 2, rpn_eval_bitor),
		rpn_eval_func('^', "bitxor",2, rpn_eval_bitxor),
		rpn_eval_func('~', "bitnot",1, rpn_eval_bitnot),
		rpn_eval_func(op_and,"and", 2, rpn_eval_and),
		rpn_eval_func(op_or,"or",   2, rpn_eval_or),
		rpn_eval_func('!', "not",   1, rpn_eval_not),
		rpn_eval_func(op_neg,"neg", 1, rpn_eval_neg),
		rpn_eval_func(' ', "pow",   2, rpn_eval_pow),
		rpn_eval_func(' ', "sqrt",  1, rpn_eval_sqrt),
		rpn_eval_func(' ', "log",   1, rpn_eval_log),
		rpn_eval_func(' ', "exp",   1, rpn_eval_exp),
		rpn_eval_func(' ', "ln",    1, rpn_eval_ln),
		rpn_eval_func(' ', "sin",   1, rpn_eval_sin),
		rpn_eval_func(' ', "cos",   1, rpn_eval_cos),
		rpn_eval_func(' ', "tan",   1, rpn_eval_tan),
		rpn_eval_func(' ', "rand",  2, rpn_eval_rand),
		rpn_eval_func(' ', "min",   2, rpn_eval_min),
		rpn_eval_func(' ', "max",   2, rpn_eval_max),
		rpn_eval_func(' ', "ceil",  1, rpn_eval_ceil),
		rpn_eval_func(' ', "round", 1, rpn_eval_round),
		rpn_eval_func(' ', "floor", 1, rpn_eval_floor),
		rpn_eval_func('<', "lt",    2, rpn_eval_lt),
		rpn_eval_func(op_lte,"lte", 2, rpn_eval_lte),
		rpn_eval_func('=', "eq",    2, rpn_eval_eq),
		rpn_eval_func(op_ne,"ne",   2, rpn_eval_ne),
		rpn_eval_func(op_gte,"gte", 2, rpn_eval_gte),
		rpn_eval_func('>', "gt",    2, rpn_eval_gt),

		rpn_eval_func('?', "iif",   3, rpn_eval_iif),
	};

	std::stack<double> argstack;

	while (!stack.empty())
	{
		start_of_loop:

		const std::string& val = stack.top();
		stack.pop();

		for (std::size_t i = 0; i < sizeof(rpn_eval_funcs) / sizeof(rpn_eval_func); ++i)
		{
			const rpn_eval_func &func = rpn_eval_funcs[i];

			if (val == func.name || (func.op != ' ' && val[0] == func.op))
			{
				std::vector<double> args(func.args);

				for (std::size_t ii = 0; ii < func.args; ++ii)
				{
					if (argstack.empty())
					{
						throw std::runtime_error("RPN Stack underflow");
					}

					args[ii] = argstack.top();
					argstack.pop();
				}

				argstack.push(func.func(args));

				if (stack.empty())
					return argstack.top();

				goto start_of_loop;
			}
		}

		auto findvar = vars.find(val);

		if (findvar != vars.end())
		{
			argstack.push(findvar->second);
		}
		else
		{
			argstack.push(util::tdparse(val));
		}
	}

	if (argstack.empty())
		return 0.0;

	return argstack.top();
}